

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_filenew(Fl_Color c)

{
  Fl_Color FVar1;
  Fl_Color c_local;
  
  fl_color(c);
  fl_begin_complex_polygon();
  fl_vertex(-0.7,-1.0);
  fl_vertex(0.1,-1.0);
  fl_vertex(0.1,-0.4);
  fl_vertex(0.7,-0.4);
  fl_vertex(0.7,1.0);
  fl_vertex(-0.7,1.0);
  fl_end_complex_polygon();
  FVar1 = fl_lighter(c);
  fl_color(FVar1);
  fl_begin_polygon();
  fl_vertex(0.1,-1.0);
  fl_vertex(0.1,-0.4);
  fl_vertex(0.7,-0.4);
  fl_end_polygon();
  FVar1 = fl_darker(c);
  fl_color(FVar1);
  fl_begin_loop();
  fl_vertex(-0.7,-1.0);
  fl_vertex(0.1,-1.0);
  fl_vertex(0.1,-0.4);
  fl_vertex(0.7,-0.4);
  fl_vertex(0.7,1.0);
  fl_vertex(-0.7,1.0);
  fl_end_loop();
  fl_begin_line();
  fl_vertex(0.1,-1.0);
  fl_vertex(0.7,-0.4);
  fl_end_line();
  return;
}

Assistant:

static void draw_filenew(Fl_Color c) {
  fl_color(c);
  BCP;
    vv(-0.7, -1.0);
    vv(0.1, -1.0);
    vv(0.1, -0.4);
    vv(0.7, -0.4);
    vv(0.7, 1.0);
    vv(-0.7, 1.0);
  ECP;

  fl_color(fl_lighter(c));
  BP;
    vv(0.1, -1.0);
    vv(0.1, -0.4);
    vv(0.7, -0.4);
  EP;

  fl_color(fl_darker(c));
  BC;
    vv(-0.7, -1.0);
    vv(0.1, -1.0);
    vv(0.1, -0.4);
    vv(0.7, -0.4);
    vv(0.7, 1.0);
    vv(-0.7, 1.0);
  EC;

  BL;
    vv(0.1, -1.0);
    vv(0.7, -0.4);
  EL;
}